

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sslexeme.cpp
# Opt level: O0

int IsStringInt(char *str)

{
  int iVar1;
  size_t sVar2;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local._4_4_ = 0;
  }
  else {
    sVar2 = strlen(str);
    if (sVar2 == 0) {
      str_local._4_4_ = 0;
    }
    else {
      for (local_1c = 0; sVar2 = strlen(str), (ulong)(long)local_1c < sVar2; local_1c = local_1c + 1
          ) {
        iVar1 = IsCharNumeric(str[local_1c]);
        if ((iVar1 == 0) && (str[local_1c] != '-')) {
          return 0;
        }
      }
      for (local_20 = 1; sVar2 = strlen(str), (ulong)(long)local_20 < sVar2; local_20 = local_20 + 1
          ) {
        if (str[local_20] == '-') {
          return 0;
        }
      }
      str_local._4_4_ = 1;
    }
  }
  return str_local._4_4_;
}

Assistant:

int IsStringInt(const char* str)
{
    if (!str)
        return FALSE;

    if (strlen(str) == 0)
        return FALSE;

    for (int i = 0; i < strlen(str); i++)
    {
        if (!IsCharNumeric(str[i]) && str[i] != '-')
            return FALSE;
    }

    for (int i = 1; i < strlen(str); i++)
    {
        if (str[i] == '-')
            return FALSE;
    }

	return TRUE;
}